

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slghsymbol.cc
# Opt level: O3

void __thiscall Constructor::addOperand(Constructor *this,OperandSymbol *sym)

{
  pointer *pppOVar1;
  iterator __position;
  string operstring;
  OperandSymbol *local_48;
  value_type local_40;
  
  local_48 = sym;
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"\n ","");
  local_40._M_dataplus._M_p[1] =
       (char)((uint)(*(int *)&(this->operands).
                              super__Vector_base<OperandSymbol_*,_std::allocator<OperandSymbol_*>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                    *(int *)&(this->operands).
                             super__Vector_base<OperandSymbol_*,_std::allocator<OperandSymbol_*>_>.
                             _M_impl.super__Vector_impl_data._M_start) >> 3) + 'A';
  __position._M_current =
       (this->operands).super__Vector_base<OperandSymbol_*,_std::allocator<OperandSymbol_*>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->operands).super__Vector_base<OperandSymbol_*,_std::allocator<OperandSymbol_*>_>._M_impl
      .super__Vector_impl_data._M_end_of_storage) {
    std::vector<OperandSymbol*,std::allocator<OperandSymbol*>>::
    _M_realloc_insert<OperandSymbol*const&>
              ((vector<OperandSymbol*,std::allocator<OperandSymbol*>> *)&this->operands,__position,
               &local_48);
  }
  else {
    *__position._M_current = sym;
    pppOVar1 = &(this->operands).
                super__Vector_base<OperandSymbol_*,_std::allocator<OperandSymbol_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    *pppOVar1 = *pppOVar1 + 1;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->printpiece,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  return;
}

Assistant:

void Constructor::addOperand(OperandSymbol *sym)

{
  string operstring = "\n ";	// Indicater character for operand
  operstring[1] = ('A'+operands.size()); // Encode index of operand
  operands.push_back(sym);
  printpiece.push_back(operstring); // Placeholder for operand's string
}